

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChQuaternion.cpp
# Opt level: O3

void chrono::Q_to_AngAxis(ChQuaternion<double> *quat,double *angle,ChVector<double> *axis)

{
  double dVar1;
  double dVar2;
  bool bVar3;
  undefined1 auVar4 [16];
  double dVar5;
  double dVar6;
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  
  auVar7._8_8_ = 0;
  auVar7._0_8_ = quat->m_data[0];
  auVar4._8_8_ = 0x7fffffffffffffff;
  auVar4._0_8_ = 0x7fffffffffffffff;
  auVar4 = vandpd_avx512vl(auVar7,auVar4);
  if (0.99999999 <= auVar4._0_8_) {
    axis->m_data[0] = 1.0;
    axis->m_data[1] = 0.0;
    axis->m_data[2] = 0.0;
    *angle = 0.0;
  }
  else {
    dVar5 = acos(quat->m_data[0]);
    dVar6 = sin(dVar5);
    dVar6 = 1.0 / dVar6;
    dVar1 = dVar6 * quat->m_data[3];
    dVar2 = dVar6 * quat->m_data[1];
    dVar6 = dVar6 * quat->m_data[2];
    *angle = dVar5 + dVar5;
    auVar8._8_8_ = 0;
    auVar8._0_8_ = dVar6 * dVar6;
    auVar10._8_8_ = 0;
    auVar10._0_8_ = dVar2;
    auVar4 = vfmadd231sd_fma(auVar8,auVar10,auVar10);
    auVar9._8_8_ = 0;
    auVar9._0_8_ = dVar1;
    auVar4 = vfmadd231sd_fma(auVar4,auVar9,auVar9);
    auVar4 = vsqrtsd_avx(auVar4,auVar4);
    dVar5 = 1.0 / auVar4._0_8_;
    bVar3 = 2.2250738585072014e-308 <= auVar4._0_8_;
    axis->m_data[0] =
         (double)((ulong)bVar3 * (long)(dVar2 * dVar5) + (ulong)!bVar3 * 0x3ff0000000000000);
    axis->m_data[1] = (double)((ulong)bVar3 * (long)(dVar6 * dVar5));
    axis->m_data[2] = (double)((ulong)bVar3 * (long)(dVar1 * dVar5));
  }
  return;
}

Assistant:

void Q_to_AngAxis(const ChQuaternion<double>& quat, double& angle, ChVector<double>& axis) {
    if (std::abs(quat.e0()) < 0.99999999) {
        double arg = acos(quat.e0());
        double invsine = 1 / sin(arg);
        ChVector<double> vtemp;
        vtemp.x() = invsine * quat.e1();
        vtemp.y() = invsine * quat.e2();
        vtemp.z() = invsine * quat.e3();
        angle = 2 * arg;
        axis = Vnorm(vtemp);
    } else {
        axis.x() = 1;
        axis.y() = 0;
        axis.z() = 0;
        angle = 0;
    }
}